

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::ResourceDataValue::getStringOrFirstOfArray
          (UnicodeString *__return_storage_ptr__,ResourceDataValue *this,UErrorCode *errorCode)

{
  ResourceData *pResData;
  uint32_t res;
  int32_t sLength;
  ConstChar16Ptr local_60;
  ConstChar16Ptr local_58 [5];
  ResourceArray array;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003daac8;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_58[0].p_ = res_getString_63(this->pResData,this->res,&sLength);
    if (local_58[0].p_ == (UChar *)0x0) {
      (*(this->super_ResourceValue).super_UObject._vptr_UObject[10])(&array,this,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if (0 < array.length) {
          pResData = this->pResData;
          res = ResourceArray::internalGetResource(&array,pResData,0);
          local_60.p_ = res_getString_63(pResData,res,&sLength);
          if (local_60.p_ != (UChar *)0x0) {
            UnicodeString::setTo(__return_storage_ptr__,'\x01',&local_60,sLength);
            return __return_storage_ptr__;
          }
        }
        *errorCode = U_RESOURCE_TYPE_MISMATCH;
      }
    }
    else {
      UnicodeString::setTo(__return_storage_ptr__,'\x01',local_58,sLength);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString ResourceDataValue::getStringOrFirstOfArray(UErrorCode &errorCode) const {
    UnicodeString us;
    if(U_FAILURE(errorCode)) {
        return us;
    }
    int32_t sLength;
    const UChar *s = res_getString(pResData, res, &sLength);
    if(s != NULL) {
        us.setTo(TRUE, s, sLength);
        return us;
    }
    ResourceArray array = getArray(errorCode);
    if(U_FAILURE(errorCode)) {
        return us;
    }
    if(array.getSize() > 0) {
        s = res_getString(pResData, array.internalGetResource(pResData, 0), &sLength);
        if(s != NULL) {
            us.setTo(TRUE, s, sLength);
            return us;
        }
    }
    errorCode = U_RESOURCE_TYPE_MISMATCH;
    return us;
}